

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

Uint32 Diligent::GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology,Uint32 Elements)

{
  uint uVar1;
  Uint32 UVar2;
  string msg;
  
  if ((byte)(Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) < 0x20) {
    uVar1 = Topology - 9;
    goto LAB_002939e6;
  }
  switch(Topology) {
  case PRIMITIVE_TOPOLOGY_UNDEFINED:
    FormatString<char[29]>(&msg,(char (*) [29])"Undefined primitive topology");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPrimitiveCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x8bf);
    goto LAB_00293ab4;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    uVar1 = 3;
    goto LAB_002939e6;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    UVar2 = 2;
    if (2 < Elements) {
      UVar2 = Elements;
    }
    Elements = UVar2 - 2;
    break;
  case PRIMITIVE_TOPOLOGY_POINT_LIST:
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST:
    Elements = Elements >> 1;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP:
    Elements = (Elements - 1) + (uint)(Elements == 0);
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
    uVar1 = 6;
LAB_002939e6:
    Elements = Elements / uVar1;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
    UVar2 = 4;
    if (4 < Elements) {
      UVar2 = Elements;
    }
    Elements = UVar2 - 4;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
    Elements = Elements >> 2;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
    UVar2 = 3;
    if (3 < Elements) {
      UVar2 = Elements;
    }
    Elements = UVar2 - 3;
    break;
  default:
    FormatString<char[30]>(&msg,(char (*) [30])"Unexpected primitive topology");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPrimitiveCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x8cd);
LAB_00293ab4:
    std::__cxx11::string::~string((string *)&msg);
    Elements = 0;
  }
  return Elements;
}

Assistant:

inline Uint32 GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology, Uint32 Elements)
{
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && Topology <= PRIMITIVE_TOPOLOGY_32_CONTROL_POINT_PATCHLIST)
    {
        return Elements / (Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
    }
    else
    {
        switch (Topology)
        {
            case PRIMITIVE_TOPOLOGY_UNDEFINED:
                UNEXPECTED("Undefined primitive topology");
                return 0;

                // clang-format off
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:      return Elements / 3;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:     return (std::max)(Elements, 2u) - 2;
            case PRIMITIVE_TOPOLOGY_POINT_LIST:         return Elements;
            case PRIMITIVE_TOPOLOGY_LINE_LIST:          return Elements / 2;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP:         return (std::max)(Elements, 1u) - 1;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:  return Elements / 6;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ: return (std::max)(Elements, 4u) - 4;
            case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:      return Elements / 4;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:     return (std::max)(Elements, 3u) - 3;
            // clang-format on
            default: UNEXPECTED("Unexpected primitive topology"); return 0;
        }
    }
}